

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::read_reference
          (Compiler *this,Ptr *node,uint16_t write_index,uint16_t *extent_index,bool write,
          ReturnType t)

{
  short sVar1;
  ushort uVar2;
  ImageObject *pIVar3;
  bool bVar4;
  element_type *peVar5;
  reference psVar6;
  ushort *puVar7;
  ulong uVar8;
  size_type sVar9;
  reference pvVar10;
  Atom *pAVar11;
  Atom local_164 [4];
  shared_ptr<r_comp::RepliStruct> local_160;
  Atom local_14c [4];
  Atom local_148 [4];
  Atom local_144 [6];
  ushort local_13e;
  Atom local_13c [4];
  Atom local_138 [2];
  uint16_t i_1;
  Atom local_134 [4];
  shared_ptr<r_comp::RepliStruct> local_130;
  Atom local_120 [4];
  Atom local_11c [4];
  Atom local_118 [4];
  Atom local_114 [6];
  ushort local_10e;
  Atom local_10c [4];
  Atom local_108 [2];
  uint16_t i;
  Atom local_104 [4];
  shared_ptr<r_comp::RepliStruct> local_100;
  uint32_t local_ec [2];
  uint32_t cast_opcode;
  Atom local_e0 [4];
  Atom local_dc [4];
  Atom local_d8 [6];
  short local_d2;
  iterator iStack_d0;
  int16_t type;
  iterator __end3;
  iterator __begin3;
  vector<short,_std::allocator<short>_> *__range3;
  Atom local_b0 [4];
  Atom local_ac [4];
  shared_ptr<r_comp::RepliStruct> local_a8;
  undefined1 local_98 [8];
  vector<short,_std::allocator<short>_> v;
  shared_ptr<r_comp::RepliStruct> local_78;
  Atom local_64 [4];
  shared_ptr<r_comp::RepliStruct> local_60 [2];
  Atom local_40 [6];
  ushort local_3a;
  ReturnType local_38;
  uint16_t index;
  ReturnType t_local;
  bool write_local;
  uint16_t *extent_index_local;
  Ptr *pPStack_20;
  uint16_t write_index_local;
  Ptr *node_local;
  Compiler *this_local;
  
  local_38 = t;
  index._1_1_ = write;
  _t_local = extent_index;
  extent_index_local._6_2_ = write_index;
  pPStack_20 = node;
  node_local = (Ptr *)this;
  if ((t == ANY) || ((t != ANY && ((this->current_class).type == t)))) {
    peVar5 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)node);
    bVar4 = std::operator==(&peVar5->cmd,"this");
    if (bVar4) {
      if ((index._1_1_ & 1) != 0) {
        r_code::Atom::This();
        pAVar11 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(this->current_object + 8),
                             (ulong)extent_index_local._6_2_);
        r_code::Atom::operator=(pAVar11,local_40);
        r_code::Atom::~Atom(local_40);
      }
      this_local._7_1_ = 1;
      goto LAB_0019f0a6;
    }
  }
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(local_60,node);
  bVar4 = local_reference(this,local_60,&local_3a,local_38);
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(local_60);
  if (bVar4) {
    if ((index._1_1_ & 1) != 0) {
      r_code::Atom::VLPointer((ushort)local_64,local_3a);
      pAVar11 = r_code::vector<r_code::Atom>::operator[]
                          ((vector<r_code::Atom> *)(this->current_object + 8),
                           (ulong)extent_index_local._6_2_);
      r_code::Atom::operator=(pAVar11,local_64);
      r_code::Atom::~Atom(local_64);
    }
    this_local._7_1_ = 1;
  }
  else {
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_78,node);
    bVar4 = global_reference(this,&local_78,&local_3a,local_38);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_78);
    if (bVar4) {
      if ((index._1_1_ & 1) != 0) {
        r_code::Atom::RPointer((short)&v + 0x14);
        pAVar11 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(this->current_object + 8),
                             (ulong)extent_index_local._6_2_);
        r_code::Atom::operator=
                  (pAVar11,(Atom *)((long)&v.super__Vector_base<short,_std::allocator<short>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        r_code::Atom::~Atom((Atom *)((long)&v.super__Vector_base<short,_std::allocator<short>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      }
      this_local._7_1_ = 1;
    }
    else {
      std::vector<short,_std::allocator<short>_>::vector
                ((vector<short,_std::allocator<short>_> *)local_98);
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_a8,node);
      bVar4 = this_indirection(this,&local_a8,(vector<short,_std::allocator<short>_> *)local_98,
                               local_38);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_a8);
      if (bVar4) {
        if ((index._1_1_ & 1) != 0) {
          r_code::Atom::IPointer((ushort)local_ac);
          pAVar11 = r_code::vector<r_code::Atom>::operator[]
                              ((vector<r_code::Atom> *)(this->current_object + 8),
                               (ulong)extent_index_local._6_2_);
          r_code::Atom::operator=(pAVar11,local_ac);
          r_code::Atom::~Atom(local_ac);
          std::vector<short,_std::allocator<short>_>::size
                    ((vector<short,_std::allocator<short>_> *)local_98);
          r_code::Atom::CPointer((uchar)local_b0);
          pIVar3 = this->current_object;
          uVar2 = *_t_local;
          *_t_local = uVar2 + 1;
          pAVar11 = r_code::vector<r_code::Atom>::operator[]
                              ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar2);
          r_code::Atom::operator=(pAVar11,local_b0);
          r_code::Atom::~Atom(local_b0);
          r_code::Atom::This();
          pIVar3 = this->current_object;
          uVar2 = *_t_local;
          *_t_local = uVar2 + 1;
          pAVar11 = r_code::vector<r_code::Atom>::operator[]
                              ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar2);
          r_code::Atom::operator=(pAVar11,(Atom *)((long)&__range3 + 4));
          r_code::Atom::~Atom((Atom *)((long)&__range3 + 4));
          __end3 = std::vector<short,_std::allocator<short>_>::begin
                             ((vector<short,_std::allocator<short>_> *)local_98);
          iStack_d0 = std::vector<short,_std::allocator<short>_>::end
                                ((vector<short,_std::allocator<short>_> *)local_98);
          while (bVar4 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff30), bVar4) {
            psVar6 = __gnu_cxx::
                     __normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::
                     operator*(&__end3);
            local_d2 = *psVar6;
            if (local_d2 == -3) {
              r_code::Atom::Vws();
              pIVar3 = this->current_object;
              uVar2 = *_t_local;
              *_t_local = uVar2 + 1;
              pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                  ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar2);
              r_code::Atom::operator=(pAVar11,local_e0);
              r_code::Atom::~Atom(local_e0);
            }
            else if (local_d2 == -2) {
              r_code::Atom::Mks();
              pIVar3 = this->current_object;
              uVar2 = *_t_local;
              *_t_local = uVar2 + 1;
              pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                  ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar2);
              r_code::Atom::operator=(pAVar11,local_dc);
              r_code::Atom::~Atom(local_dc);
            }
            else if (local_d2 == -1) {
              r_code::Atom::View();
              pIVar3 = this->current_object;
              uVar2 = *_t_local;
              *_t_local = uVar2 + 1;
              pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                  ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar2);
              r_code::Atom::operator=(pAVar11,local_d8);
              r_code::Atom::~Atom(local_d8);
            }
            else {
              r_code::Atom::IPointer((ushort)&cast_opcode);
              pIVar3 = this->current_object;
              uVar2 = *_t_local;
              *_t_local = uVar2 + 1;
              pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                  ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar2);
              r_code::Atom::operator=(pAVar11,(Atom *)&cast_opcode);
              r_code::Atom::~Atom((Atom *)&cast_opcode);
            }
            __gnu_cxx::__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>::
            operator++(&__end3);
          }
        }
        this_local._7_1_ = 1;
      }
      else {
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_100,node);
        bVar4 = local_indirection(this,&local_100,(vector<short,_std::allocator<short>_> *)local_98,
                                  local_38,local_ec);
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_100);
        if (bVar4) {
          if ((index._1_1_ & 1) != 0) {
            r_code::Atom::IPointer((ushort)local_104);
            pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                ((vector<r_code::Atom> *)(this->current_object + 8),
                                 (ulong)extent_index_local._6_2_);
            r_code::Atom::operator=(pAVar11,local_104);
            r_code::Atom::~Atom(local_104);
            std::vector<short,_std::allocator<short>_>::size
                      ((vector<short,_std::allocator<short>_> *)local_98);
            r_code::Atom::CPointer((uchar)local_108);
            pIVar3 = this->current_object;
            uVar2 = *_t_local;
            *_t_local = uVar2 + 1;
            pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar2);
            r_code::Atom::operator=(pAVar11,local_108);
            r_code::Atom::~Atom(local_108);
            puVar7 = (ushort *)
                     std::vector<short,_std::allocator<short>_>::operator[]
                               ((vector<short,_std::allocator<short>_> *)local_98,0);
            r_code::Atom::VLPointer((ushort)local_10c,*puVar7);
            pIVar3 = this->current_object;
            uVar2 = *_t_local;
            *_t_local = uVar2 + 1;
            pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar2);
            r_code::Atom::operator=(pAVar11,local_10c);
            r_code::Atom::~Atom(local_10c);
            for (local_10e = 1; uVar8 = (ulong)local_10e,
                sVar9 = std::vector<short,_std::allocator<short>_>::size
                                  ((vector<short,_std::allocator<short>_> *)local_98), uVar8 < sVar9
                ; local_10e = local_10e + 1) {
              pvVar10 = std::vector<short,_std::allocator<short>_>::operator[]
                                  ((vector<short,_std::allocator<short>_> *)local_98,
                                   (ulong)local_10e);
              sVar1 = *pvVar10;
              if (sVar1 == -3) {
                r_code::Atom::Vws();
                pIVar3 = this->current_object;
                uVar2 = *_t_local;
                *_t_local = uVar2 + 1;
                pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                    ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar2);
                r_code::Atom::operator=(pAVar11,local_11c);
                r_code::Atom::~Atom(local_11c);
              }
              else if (sVar1 == -2) {
                r_code::Atom::Mks();
                pIVar3 = this->current_object;
                uVar2 = *_t_local;
                *_t_local = uVar2 + 1;
                pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                    ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar2);
                r_code::Atom::operator=(pAVar11,local_118);
                r_code::Atom::~Atom(local_118);
              }
              else if (sVar1 == -1) {
                r_code::Atom::View();
                pIVar3 = this->current_object;
                uVar2 = *_t_local;
                *_t_local = uVar2 + 1;
                pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                    ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar2);
                r_code::Atom::operator=(pAVar11,local_114);
                r_code::Atom::~Atom(local_114);
              }
              else {
                std::vector<short,_std::allocator<short>_>::operator[]
                          ((vector<short,_std::allocator<short>_> *)local_98,(ulong)local_10e);
                r_code::Atom::IPointer((ushort)local_120);
                pIVar3 = this->current_object;
                uVar2 = *_t_local;
                *_t_local = uVar2 + 1;
                pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                    ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar2);
                r_code::Atom::operator=(pAVar11,local_120);
                r_code::Atom::~Atom(local_120);
              }
            }
          }
          this_local._7_1_ = 1;
        }
        else {
          std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_130,node);
          bVar4 = global_indirection(this,&local_130,
                                     (vector<short,_std::allocator<short>_> *)local_98,local_38);
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_130);
          if (bVar4) {
            if ((index._1_1_ & 1) != 0) {
              r_code::Atom::IPointer((ushort)local_134);
              pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                  ((vector<r_code::Atom> *)(this->current_object + 8),
                                   (ulong)extent_index_local._6_2_);
              r_code::Atom::operator=(pAVar11,local_134);
              r_code::Atom::~Atom(local_134);
              std::vector<short,_std::allocator<short>_>::size
                        ((vector<short,_std::allocator<short>_> *)local_98);
              r_code::Atom::CPointer((uchar)local_138);
              pIVar3 = this->current_object;
              uVar2 = *_t_local;
              *_t_local = uVar2 + 1;
              pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                  ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar2);
              r_code::Atom::operator=(pAVar11,local_138);
              r_code::Atom::~Atom(local_138);
              std::vector<short,_std::allocator<short>_>::operator[]
                        ((vector<short,_std::allocator<short>_> *)local_98,0);
              r_code::Atom::RPointer((ushort)local_13c);
              pIVar3 = this->current_object;
              uVar2 = *_t_local;
              *_t_local = uVar2 + 1;
              pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                  ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar2);
              r_code::Atom::operator=(pAVar11,local_13c);
              r_code::Atom::~Atom(local_13c);
              for (local_13e = 1; uVar8 = (ulong)local_13e,
                  sVar9 = std::vector<short,_std::allocator<short>_>::size
                                    ((vector<short,_std::allocator<short>_> *)local_98),
                  uVar8 < sVar9; local_13e = local_13e + 1) {
                pvVar10 = std::vector<short,_std::allocator<short>_>::operator[]
                                    ((vector<short,_std::allocator<short>_> *)local_98,
                                     (ulong)local_13e);
                if (*pvVar10 == -3) {
                  r_code::Atom::Vws();
                  pIVar3 = this->current_object;
                  uVar2 = *_t_local;
                  *_t_local = uVar2 + 1;
                  pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                      ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar2);
                  r_code::Atom::operator=(pAVar11,local_148);
                  r_code::Atom::~Atom(local_148);
                }
                else if (*pvVar10 == -2) {
                  r_code::Atom::Mks();
                  pIVar3 = this->current_object;
                  uVar2 = *_t_local;
                  *_t_local = uVar2 + 1;
                  pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                      ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar2);
                  r_code::Atom::operator=(pAVar11,local_144);
                  r_code::Atom::~Atom(local_144);
                }
                else {
                  std::vector<short,_std::allocator<short>_>::operator[]
                            ((vector<short,_std::allocator<short>_> *)local_98,(ulong)local_13e);
                  r_code::Atom::IPointer((ushort)local_14c);
                  pIVar3 = this->current_object;
                  uVar2 = *_t_local;
                  *_t_local = uVar2 + 1;
                  pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                      ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar2);
                  r_code::Atom::operator=(pAVar11,local_14c);
                  r_code::Atom::~Atom(local_14c);
                }
              }
            }
            this_local._7_1_ = 1;
          }
          else {
            std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_160,node);
            bVar4 = hlp_reference(this,&local_160,&local_3a);
            std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_160);
            if (bVar4) {
              if ((index._1_1_ & 1) != 0) {
                r_code::Atom::VLPointer((ushort)local_164,local_3a);
                pAVar11 = r_code::vector<r_code::Atom>::operator[]
                                    ((vector<r_code::Atom> *)(this->current_object + 8),
                                     (ulong)extent_index_local._6_2_);
                r_code::Atom::operator=(pAVar11,local_164);
                r_code::Atom::~Atom(local_164);
              }
              this_local._7_1_ = 1;
            }
            else {
              this_local._7_1_ = 0;
            }
          }
        }
      }
      local_ec[1] = 1;
      std::vector<short,_std::allocator<short>_>::~vector
                ((vector<short,_std::allocator<short>_> *)local_98);
    }
  }
LAB_0019f0a6:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Compiler::read_reference(RepliStruct::Ptr node, uint16_t write_index, uint16_t &extent_index, bool write, const ReturnType t)
{
    uint16_t index;

    if ((t == ANY || (t != ANY && current_class.type == t)) && node->cmd == "this") {
        if (write) {
            current_object->code[write_index] = Atom::This();
        }

        return true;
    }

    if (local_reference(node, index, t)) {
        if (write) {
            current_object->code[write_index] = Atom::VLPointer(index);    // local references are always pointing to the value array
        }

        return true;
    }

    if (global_reference(node, index, t)) { // index is the index held by a reference pointer
        if (write) {
            current_object->code[write_index] = Atom::RPointer(index);
        }

        return true;
    }

    std::vector<int16_t> v;

    if (this_indirection(node, v, t)) {
        if (write) {
            current_object->code[write_index] = Atom::IPointer(extent_index);
            current_object->code[extent_index++] = Atom::CPointer(v.size() + 1);
            current_object->code[extent_index++] = Atom::This();

            for (int16_t type : v) {
                switch (type) {
                case -1:
                    current_object->code[extent_index++] = Atom::View();
                    break;

                case -2:
                    current_object->code[extent_index++] = Atom::Mks();
                    break;

                case -3:
                    current_object->code[extent_index++] = Atom::Vws();
                    break;

                default:
                    current_object->code[extent_index++] = Atom::IPointer(type);
                    break;
                }
            }
        }

        return true;
    }

    uint32_t cast_opcode;

    if (local_indirection(node, v, t, cast_opcode)) {
        if (write) {
            current_object->code[write_index] = Atom::IPointer(extent_index);
            current_object->code[extent_index++] = Atom::CPointer(v.size());
            current_object->code[extent_index++] = Atom::VLPointer(v[0], cast_opcode);

            for (uint16_t i = 1; i < v.size(); ++i) {
                switch (v[i]) {
                case -1:
                    current_object->code[extent_index++] = Atom::View();
                    break;

                case -2:
                    current_object->code[extent_index++] = Atom::Mks();
                    break;

                case -3:
                    current_object->code[extent_index++] = Atom::Vws();
                    break;

                default:
                    current_object->code[extent_index++] = Atom::IPointer(v[i]);
                    break;
                }
            }
        }

        return true;
    }

    if (global_indirection(node, v, t)) { // v[0] is the index held by a reference pointer
        if (write) {
            current_object->code[write_index] = Atom::IPointer(extent_index);
            current_object->code[extent_index++] = Atom::CPointer(v.size());
            current_object->code[extent_index++] = Atom::RPointer(v[0]);

            for (uint16_t i = 1; i < v.size(); ++i) {
                switch (v[i]) {
                case -2:
                    current_object->code[extent_index++] = Atom::Mks();
                    break;

                case -3:
                    current_object->code[extent_index++] = Atom::Vws();
                    break;

                default:
                    current_object->code[extent_index++] = Atom::IPointer(v[i]);
                    break;
                }
            }
        }

        return true;
    }

    if (hlp_reference(node, index)) {
        if (write) {
            current_object->code[write_index] = Atom::VLPointer(index);
        }

        return true;
    }

    return false;
}